

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
adios2::format::BP5Helper::BuildFixedNodeContrib
          (digest attrHash,size_t attrSize,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MMBlocks,size_t MetaEncodeSize,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_R8;
  undefined8 in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_t AlignedSize;
  value_type *MM;
  size_t i;
  node_contrib *NC;
  size_t len;
  vector<char,_std::allocator<char>_> *ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  vector<char,_std::allocator<char>_> *__new_size;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  ulong local_60;
  
  __new_size = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xd1d2c7);
  std::vector<char,_std::allocator<char>_>::resize(in_stack_ffffffffffffff90,(size_type)__new_size);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0xd1d2eb);
  *(undefined8 *)pcVar2 = in_RSI;
  *(undefined8 *)(pcVar2 + 8) = in_RDX;
  *(undefined8 *)(pcVar2 + 0x10) = in_RCX;
  sVar3 = std::
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          ::size(in_R8);
  *(size_type *)(pcVar2 + 0x18) = sVar3;
  this = in_stack_00000008;
  for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
    sVar3 = std::
            vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            ::size(in_R8);
    if (local_60 < sVar3) {
      pvVar4 = std::
               vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
               ::operator[](in_R8,local_60);
      memcpy(pcVar2 + local_60 * 0x10 + 0x20,pvVar4->MetaMetaID,pvVar4->MetaMetaIDLen);
      *(size_t *)(pcVar2 + local_60 * 8 + 0x60) = pvVar4->MetaMetaInfoLen + 7 & 0xfffffffffffffff8;
    }
    else {
      pcVar1 = pcVar2 + local_60 * 8 + 0x60;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
  }
  *(undefined8 *)(pcVar2 + 0x80) = in_R9;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
  *(value_type *)(pcVar2 + 0x88) = *pvVar5;
  return in_RDI;
}

Assistant:

std::vector<char>
BP5Helper::BuildFixedNodeContrib(const digest attrHash, const size_t attrSize,
                                 const std::vector<BP5Base::MetaMetaInfoBlock> MMBlocks,
                                 const size_t MetaEncodeSize,
                                 const std::vector<uint64_t> WriterDataPositions)
{
    /*
     * WriterDataPositions comes in as a vector, but in current usage,
     * that vector only has a single entry
     *
     * MMBlocks may have more than FIXED_MMB_SLOT_COUNT entries, and
     * if so they will be handled in a special phase.
     */
    std::vector<char> ret;
    size_t len = sizeof(node_contrib);
    ret.resize(len);
    auto NC = reinterpret_cast<node_contrib *>(ret.data());
    NC->AttrHash = attrHash;
    NC->AttrSize = attrSize;
    NC->MMBCount = MMBlocks.size();
    for (size_t i = 0; i < FIXED_MMB_SLOT_COUNT; i++)
    {
        if (i < MMBlocks.size())
        {
            auto MM = &MMBlocks[i];
            std::memcpy(&NC->MMBArray[i].x[0], MM->MetaMetaID, MM->MetaMetaIDLen);
            size_t AlignedSize = ((MM->MetaMetaInfoLen + 7) & ~0x7);
            NC->MMBSizeArray[i] = AlignedSize;
        }
        else
        {
            NC->MMBSizeArray[i] = 0;
        }
    }
    NC->MetaEncodeSize = MetaEncodeSize;
    NC->WriterDataPosition = WriterDataPositions[0];
    return ret;
}